

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

string * __thiscall tinyusdz::Path::variant_part_abi_cxx11_(Path *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Path *local_10;
  Path *this_local;
  
  local_10 = this;
  ::std::operator+(&local_90,"{",&this->_variant_part);
  ::std::operator+(&local_70,&local_90,"=");
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
  ::std::operator+(&local_30,&local_50,"}");
  ::std::__cxx11::string::operator=((string *)&this->_variant_part_str,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_90);
  return &this->_variant_part_str;
}

Assistant:

const std::string &variant_part() const {
    _variant_part_str =
        "{" + _variant_part + "=" + _variant_selection_part + "}";
    return _variant_part_str;
  }